

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void bhdct_setup_string_key
               (planck_unit_test_t *tc,ion_dictionary_handler_t *handler,ion_dictionary_t *dict,
               ion_behaviour_fill_level_e fill_level)

{
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  char acStack_30 [4];
  int i;
  char key [9];
  ion_behaviour_fill_level_e fill_level_local;
  ion_dictionary_t *dict_local;
  ion_dictionary_handler_t *handler_local;
  planck_unit_test_t *tc_local;
  
  key._4_4_ = fill_level;
  unique0x10000187 = dict;
  bhdct_master_table_init(tc);
  (*bhdct_context.init_fcn)(handler);
  bhdct_dictionary_initialization
            (tc,handler,stack0xffffffffffffffe0,key_type_null_terminated_string,7,4,
             bhdct_context.dictionary_size);
  key[0] = '\0';
  _acStack_30 = 0;
  switch(key._4_4_) {
  case 0:
    return;
  case 4:
    for (local_34 = 0xffffff9c; (int)local_34 < -0x32; local_34 = local_34 + 2) {
      sprintf(acStack_30,"k%d",(ulong)local_34);
      local_38 = local_34 * 3;
      bhdct_insert(tc,stack0xffffffffffffffe0,acStack_30,&local_38,'\x01');
    }
  case 3:
    for (local_34 = 500; (int)local_34 < 1000; local_34 = local_34 + 5) {
      sprintf(acStack_30,"k%d",(ulong)local_34);
      local_3c = local_34 * 10;
      bhdct_insert(tc,stack0xffffffffffffffe0,acStack_30,&local_3c,'\x01');
    }
  case 2:
    for (local_34 = 0x32; (int)local_34 < 100; local_34 = local_34 + 2) {
      sprintf(acStack_30,"k%d",(ulong)local_34);
      local_40 = local_34 * 5;
      bhdct_insert(tc,stack0xffffffffffffffe0,acStack_30,&local_40,'\x01');
    }
  case 1:
    for (local_34 = 0; (int)local_34 < 10; local_34 = local_34 + 1) {
      sprintf(acStack_30,"k%d",(ulong)local_34);
      local_44 = local_34 << 1;
      bhdct_insert(tc,stack0xffffffffffffffe0,acStack_30,&local_44,'\x01');
    }
    return;
  default:
    return;
  }
}

Assistant:

void
bhdct_setup_string_key(
	planck_unit_test_t			*tc,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dict,
	ion_behaviour_fill_level_e	fill_level
) {
	bhdct_master_table_init(tc);
	bhdct_context.init_fcn(handler);
	/* Note most of these are fixed except the dictionary size */
	bhdct_dictionary_initialization(tc, handler, dict, key_type_null_terminated_string, 7, sizeof(int), bhdct_context.dictionary_size);

	char key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	/* This switch statement intentionally doesn't have breaks - we want it to fall through. */
	int i;

	switch (fill_level) {
		case ion_fill_edge_cases: {
			ION_FILL_EDGE_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_EDGE_VALUE(i), boolean_true);
			}
		}

		case ion_fill_high: {
			ION_FILL_HIGH_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_HIGH_VALUE(i), boolean_true);
			}
		}

		case ion_fill_medium: {
			ION_FILL_MEDIUM_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_MEDIUM_VALUE(i), boolean_true);
			}
		}

		case ion_fill_low: {
			ION_FILL_LOW_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_LOW_VALUE(i), boolean_true);
			}
		}

		case ion_fill_none: {
			/* Intentionally left blank */
		}
	}
}